

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bingo.hpp
# Opt level: O2

void __thiscall BingoGenerator::init_tree_cutting_goals(BingoGenerator *this)

{
  int __val;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (__val = 4; __val != 0xd; __val = __val + 1) {
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70,"Cut ",&local_90);
    std::operator+(&local_50,&local_70," Sacred Trees using Axe Magic");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_tree_cutting_goals,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  vectools::shuffle<std::__cxx11::string>(&this->_tree_cutting_goals,&this->_rng);
  return;
}

Assistant:

void init_tree_cutting_goals()
    {
        for(int i=4 ; i <= 12 ; ++i)
            _tree_cutting_goals.emplace_back("Cut " + std::to_string(i) + " Sacred Trees using Axe Magic");
        vectools::shuffle(_tree_cutting_goals, _rng);
    }